

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::
testGetTransformFeedbacki_vQueryForInvalidParameterName(ErrorsTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  bool bVar6;
  GLint buffer;
  GLuint xfb;
  GLint local_1c8;
  GLuint local_1c4;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_1c4 = 0;
  (**(code **)(lVar5 + 0x408))(1,&local_1c4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x525);
  local_1c8 = 0x4cb2f;
  (*this->m_gl_getTransformFeedbacki_v)(local_1c4,0,0,&local_1c8);
  iVar2 = (**(code **)(lVar5 + 0x800))();
  if (iVar2 != 0x500) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetTransformFeedbacki_v called with invalid parameter name had been expected to generate GL_INVALID_ENUM. However, "
               ,0x75);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," was captured.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  bVar6 = local_1c8 != 0x4cb2f;
  if (bVar6) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetTransformFeedbacki_v called with invalid parameter name had been expected not to change the given buffer."
               ,0x6e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  iVar4 = (**(code **)(lVar5 + 0x800))();
  if (iVar4 != 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    do {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Warning! glGetTransformFeedbacki_v called with invalid parameter name has generated more than one error, The next error was  "
                 ,0x7d);
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar4;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      iVar4 = (**(code **)(lVar5 + 0x800))();
    } while (iVar4 != 0);
  }
  (**(code **)(lVar5 + 0x488))(1,&local_1c4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glDeleteTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x554);
  return !bVar6 && iVar2 == 0x500;
}

Assistant:

bool ErrorsTest::testGetTransformFeedbacki_vQueryForInvalidParameterName()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating XFB object. */
	glw::GLuint xfb = 0;

	gl.createTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Generating invalid parameter name. */
	glw::GLuint invalid_parameter_name = 0;

	/* Dummy storage. */
	glw::GLint buffer = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Default result. */
	bool is_ok = true;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbacki_v(xfb, invalid_parameter_name, 0, &buffer);

	if (GL_INVALID_ENUM != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid parameter name had been "
											   "expected to generate GL_INVALID_ENUM. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid parameter name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki_v called with invalid parameter name "
											   "has generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Clean-up. */
	gl.deleteTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTransformFeedbacks have failed");

	return is_ok;
}